

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O0

void __thiscall
rapic::client::client
          (client *this,size_t buffer_size,time_t keepalive_period,time_t inactivity_timeout)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  string *in_RDI;
  string *this_00;
  string *__p;
  
  __p = in_RDI;
  std::__cxx11::string::string(in_RDI);
  this_00 = in_RDI + 0x20;
  std::__cxx11::string::string(this_00);
  *(undefined8 *)(in_RDI + 0x40) = in_RDX;
  *(undefined8 *)(in_RDI + 0x48) = in_RCX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x113af6);
  *(undefined4 *)(in_RDI + 0x68) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x6c) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  std::__cxx11::string::string(in_RDI + 0x80);
  operator_new__(in_RSI);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this_00,
             (uchar *)__p);
  *(ulong *)(__p + 0xa8) = in_RSI;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)this_00,(__integral_type)__p);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)this_00,(__integral_type)__p);
  *(undefined4 *)(__p + 0xc0) = 0xffffffff;
  *(undefined8 *)(__p + 200) = 0;
  return;
}

Assistant:

client::client(size_t buffer_size, time_t keepalive_period, time_t inactivity_timeout)
  : keepalive_period_{keepalive_period}
  , inactivity_timeout_{inactivity_timeout}
  , socket_{-1}
  , state_{rapic::connection_state::disconnected}
  , last_keepalive_{0}
  , last_activity_{0}
  , buffer_{new uint8_t[buffer_size]}
  , capacity_{buffer_size}
  , wcount_{0}
  , rcount_{0}
  , cur_type_{no_message}
  , cur_size_{0}
{ }